

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O1

void __thiscall
SQNativeClosure::SQNativeClosure(SQNativeClosure *this,SQSharedState *ss,SQFUNCTION func)

{
  SQAllocContext pSVar1;
  
  (this->super_SQCollectable).super_SQRefCounted._uiRef = 0;
  (this->super_SQCollectable).super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQNativeClosure_001a5330;
  pSVar1 = ss->_alloc_ctx;
  (this->_typecheck)._vals = (long *)0x0;
  (this->_typecheck)._alloc_ctx = pSVar1;
  (this->_typecheck)._size = 0;
  (this->_typecheck)._allocated = 0;
  (this->_name).super_SQObject._type = 0;
  (this->_name).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_name).super_SQObject.field_0x5 = 0;
  (this->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_name).super_SQObject._type = OT_NULL;
  (this->_docstring).super_SQObject._type = 0;
  (this->_docstring).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_docstring).super_SQObject.field_0x5 = 0;
  (this->_docstring).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_docstring).super_SQObject._type = OT_NULL;
  this->_function = func;
  (this->super_SQCollectable)._gc_next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._gc_prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  this->_env = (SQWeakRef *)0x0;
  return;
}

Assistant:

SQNativeClosure(SQSharedState *ss,SQFUNCTION func) :
      _typecheck(ss->_alloc_ctx)
    {
      _function=func;INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this); _env = NULL;
    }